

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

void __thiscall wasm::I64ToI32Lowering::visitStore(I64ToI32Lowering *this,Store *curr)

{
  uint align;
  bool bVar1;
  Index IVar2;
  address64_t aVar3;
  address64_t aVar4;
  uchar *puVar5;
  uint *puVar6;
  pointer pBVar7;
  LocalGet *pLVar8;
  pointer pBVar9;
  LocalGet *value;
  Block *expression;
  Type local_c8;
  Type local_c0;
  Type local_b8;
  uint local_b0;
  uint local_ac;
  Address local_a8;
  Store *local_a0;
  Store *storeHigh;
  LocalSet *local_90;
  LocalSet *setPtr;
  undefined1 local_80 [8];
  TempVar ptrTemp;
  Type local_50;
  uint local_44;
  uint local_40;
  uchar local_3a;
  char local_39;
  undefined1 local_38 [7];
  uint8_t bytes;
  TempVar highBits;
  Store *curr_local;
  I64ToI32Lowering *this_local;
  
  highBits.ty.id = (uintptr_t)curr;
  bVar1 = hasOutParam(this,curr->value);
  if (bVar1) {
    aVar3 = wasm::Address::operator_cast_to_unsigned_long((Address *)(highBits.ty.id + 0x18));
    aVar4 = wasm::Address::operator_cast_to_unsigned_long((Address *)(highBits.ty.id + 0x18));
    if (aVar3 + 4 <= aVar4) {
      __assert_fail("curr->offset + 4 > curr->offset",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                    ,0x1cc,"void wasm::I64ToI32Lowering::visitStore(Store *)");
    }
    if ((*(byte *)(highBits.ty.id + 0x28) & 1) != 0) {
      __assert_fail("!curr->isAtomic && \"atomic store not implemented\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                    ,0x1cd,"void wasm::I64ToI32Lowering::visitStore(Store *)");
    }
    fetchOutParam((TempVar *)local_38,this,*(Expression **)(highBits.ty.id + 0x38));
    local_39 = *(char *)(highBits.ty.id + 0x10);
    local_3a = '\x04';
    puVar5 = std::min<unsigned_char>((uchar *)(highBits.ty.id + 0x10),&local_3a);
    *(uchar *)(highBits.ty.id + 0x10) = *puVar5;
    aVar3 = wasm::Address::operator_cast_to_unsigned_long((Address *)(highBits.ty.id + 0x20));
    local_40 = (uint)aVar3;
    local_44 = 4;
    puVar6 = std::min<unsigned_int>(&local_40,&local_44);
    wasm::Address::operator=((Address *)(highBits.ty.id + 0x20),(ulong)*puVar6);
    wasm::Type::Type(&local_50,i32);
    *(uintptr_t *)(highBits.ty.id + 0x40) = local_50.id;
    if (local_39 == '\b') {
      wasm::Type::Type((Type *)&setPtr,i32);
      getTemp((TempVar *)local_80,this,(Type)setPtr);
      pBVar7 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (&this->builder);
      IVar2 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_80);
      local_90 = Builder::makeLocalSet(pBVar7,IVar2,*(Expression **)(highBits.ty.id + 0x30));
      pBVar7 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (&this->builder);
      IVar2 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_80);
      wasm::Type::Type((Type *)&storeHigh,i32);
      pLVar8 = Builder::makeLocalGet(pBVar7,IVar2,(Type)storeHigh);
      *(LocalGet **)(highBits.ty.id + 0x30) = pLVar8;
      Store::finalize((Store *)highBits.ty.id);
      pBVar7 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (&this->builder);
      aVar3 = wasm::Address::operator_cast_to_unsigned_long((Address *)(highBits.ty.id + 0x18));
      wasm::Address::Address(&local_a8,aVar3 + 4);
      aVar3 = wasm::Address::operator_cast_to_unsigned_long((Address *)(highBits.ty.id + 0x20));
      local_ac = (uint)aVar3;
      local_b0 = 4;
      puVar6 = std::min<unsigned_int>(&local_ac,&local_b0);
      align = *puVar6;
      pBVar9 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (&this->builder);
      IVar2 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_80);
      wasm::Type::Type(&local_b8,i32);
      pLVar8 = Builder::makeLocalGet(pBVar9,IVar2,local_b8);
      pBVar9 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (&this->builder);
      IVar2 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_38);
      wasm::Type::Type(&local_c0,i32);
      value = Builder::makeLocalGet(pBVar9,IVar2,local_c0);
      wasm::Type::Type(&local_c8,i32);
      local_a0 = Builder::makeStore(pBVar7,4,local_a8,align,(Expression *)pLVar8,(Expression *)value
                                    ,local_c8,(Name)((IString *)(highBits.ty.id + 0x48))->str);
      pBVar7 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (&this->builder);
      expression = Builder::blockify<wasm::Store*>
                             (pBVar7,(Expression *)local_90,(Expression *)highBits.ty.id,local_a0);
      Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
                (&(this->
                  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                  ).
                  super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                  .
                  super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                 ,(Expression *)expression);
      TempVar::~TempVar((TempVar *)local_80);
    }
    TempVar::~TempVar((TempVar *)local_38);
  }
  return;
}

Assistant:

void visitStore(Store* curr) {
    if (!hasOutParam(curr->value)) {
      return;
    }
    assert(curr->offset + 4 > curr->offset);
    assert(!curr->isAtomic && "atomic store not implemented");
    TempVar highBits = fetchOutParam(curr->value);
    uint8_t bytes = curr->bytes;
    curr->bytes = std::min(curr->bytes, uint8_t(4));
    curr->align = std::min(uint32_t(curr->align), uint32_t(4));
    curr->valueType = Type::i32;
    if (bytes == 8) {
      TempVar ptrTemp = getTemp();
      LocalSet* setPtr = builder->makeLocalSet(ptrTemp, curr->ptr);
      curr->ptr = builder->makeLocalGet(ptrTemp, Type::i32);
      curr->finalize();
      Store* storeHigh =
        builder->makeStore(4,
                           curr->offset + 4,
                           std::min(uint32_t(curr->align), uint32_t(4)),
                           builder->makeLocalGet(ptrTemp, Type::i32),
                           builder->makeLocalGet(highBits, Type::i32),
                           Type::i32,
                           curr->memory);
      replaceCurrent(builder->blockify(setPtr, curr, storeHigh));
    }
  }